

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void AddSimpleField(FMFieldList *FieldP,int *CountP,char *Name,char *Type,int ElementSize)

{
  long lVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 *puVar4;
  char *in_RCX;
  char *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int in_R8D;
  int PriorFieldSize;
  FMFieldList PriorField;
  FMFieldList Field;
  int Offset;
  int local_3c;
  int local_28;
  
  local_28 = 0;
  if (*in_RSI != 0) {
    lVar1 = *in_RDI + (long)(*in_RSI + -1) * 0x18;
    local_3c = *(int *)(lVar1 + 0x10);
    pcVar2 = strchr(*(char **)(lVar1 + 8),0x5b);
    if (pcVar2 != (char *)0x0) {
      local_3c = 8;
    }
    local_28 = ((*(int *)(lVar1 + 0x14) + local_3c + in_R8D + -1) / in_R8D) * in_R8D;
  }
  if (*in_RDI == 0) {
    pvVar3 = malloc((long)(*in_RSI + 2) * 0x18);
    *in_RDI = (long)pvVar3;
  }
  else {
    pvVar3 = realloc((void *)*in_RDI,(long)(*in_RSI + 2) * 0x18);
    *in_RDI = (long)pvVar3;
  }
  puVar4 = (undefined8 *)(*in_RDI + (long)*in_RSI * 0x18);
  *in_RSI = *in_RSI + 1;
  pcVar2 = strdup(in_RDX);
  *puVar4 = pcVar2;
  pcVar2 = strdup(in_RCX);
  puVar4[1] = pcVar2;
  *(int *)(puVar4 + 2) = in_R8D;
  *(int *)((long)puVar4 + 0x14) = local_28;
  puVar4[3] = 0;
  puVar4[4] = 0;
  *(undefined4 *)(puVar4 + 5) = 0;
  *(undefined4 *)((long)puVar4 + 0x2c) = 0;
  return;
}

Assistant:

static void AddSimpleField(FMFieldList *FieldP, int *CountP, const char *Name, const char *Type,
                           int ElementSize)
{
    int Offset = 0;
    FMFieldList Field;
    if (*CountP)
    {
        FMFieldList PriorField;
        PriorField = &((*FieldP)[(*CountP) - 1]);
        int PriorFieldSize = PriorField->field_size;
        if (strchr(PriorField->field_type, '['))
        {
            // really a pointer
            PriorFieldSize = sizeof(void *);
        }
        Offset = ((PriorField->field_offset + PriorFieldSize + ElementSize - 1) / ElementSize) *
                 ElementSize;
    }
    if (*FieldP)
        *FieldP = realloc(*FieldP, (*CountP + 2) * sizeof((*FieldP)[0]));
    else
        *FieldP = malloc((*CountP + 2) * sizeof((*FieldP)[0]));

    Field = &((*FieldP)[*CountP]);
    (*CountP)++;
    Field->field_name = strdup(Name);
    Field->field_type = strdup(Type);
    Field->field_size = ElementSize;
    Field->field_offset = Offset;
    Field++;
    Field->field_name = NULL;
    Field->field_type = NULL;
    Field->field_size = 0;
    Field->field_offset = 0;
}